

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O1

FT_Error BDF_Face_Init(FT_Stream stream,FT_Face bdfface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  char cVar1;
  FT_Memory memory;
  bdf_font_t *font;
  char *pcVar2;
  FT_Face pFVar3;
  void *__src;
  bdf_glyph_t *pbVar4;
  undefined1 auVar5 [16];
  FT_Error FVar6;
  long lVar7;
  short sVar8;
  short sVar9;
  undefined4 uVar10;
  uint uVar11;
  int iVar12;
  ulong *P;
  undefined1 *block;
  FT_ULong FVar13;
  bdf_property_t *pbVar14;
  FT_String *pFVar15;
  size_t sVar16;
  size_t sVar17;
  FT_Bitmap_Size *pFVar18;
  ulong uVar19;
  FT_Pointer pvVar20;
  undefined2 *puVar21;
  bdf_property_t *pbVar22;
  byte *pbVar23;
  int iVar24;
  anon_union_8_3_ccdffb78_for_value *paVar25;
  short sVar26;
  FT_Memory pFVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  FT_Long FVar32;
  long *plVar33;
  bdf_font_t *font_00;
  long lVar34;
  bool bVar35;
  FT_Error error;
  FT_Error error_2;
  _bdf_line_func_t cb;
  FT_Error error_1;
  bdf_options_t options;
  FT_Error local_e0;
  FT_Error local_dc;
  FT_Face local_d8;
  FT_Int local_cc;
  FT_Memory local_c8;
  ulong *local_c0;
  undefined1 local_b8 [8];
  char *pcStack_b0;
  char *local_a8;
  char *pcStack_a0;
  ulong local_98;
  undefined1 *local_90;
  size_t local_88 [4];
  FT_Memory local_68;
  long local_60;
  FT_Stream local_58;
  size_t local_50;
  FT_ULong local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_e0 = 0;
  pFVar27 = bdfface->memory;
  local_e0 = FT_Stream_Seek(stream,0);
  if (local_e0 != 0) {
    return local_e0;
  }
  local_40 = 0x100000001;
  uStack_38 = 0x800000000;
  local_dc = 0;
  local_58 = stream;
  P = (ulong *)ft_mem_alloc(pFVar27,0x44078,&local_dc);
  if (local_dc != 0) {
    font_00 = (bdf_font_t *)0x0;
    goto LAB_0013afca;
  }
  P[8] = (ulong)&local_40;
  *(undefined2 *)(P + 3) = 0x7fff;
  P[0x880e] = local_58->size;
  P[0x880d] = (ulong)pFVar27;
  P[0x880b] = 0;
  P[0x880c] = 0;
  P[0x8809] = 0;
  P[0x880a] = 0;
  P[0x880c] = (ulong)pFVar27;
  local_68 = local_58->memory;
  local_88[0] = local_88[0] & 0xffffffff00000000;
  local_c0 = P;
  block = (undefined1 *)ft_mem_realloc(local_68,1,0,0x400,(void *)0x0,(FT_Error *)local_88);
  if ((int)local_88[0] == 0) {
    local_98 = 0x400;
    local_60 = 1;
    local_b8 = (undefined1  [8])_bdf_parse_start;
    *block = 0;
    iVar12 = 0x100;
    FVar13 = 0;
    sVar16 = 0;
    lVar30 = 0;
    local_d8 = bdfface;
    local_cc = face_index;
    local_c8 = pFVar27;
LAB_0013ad74:
    do {
      local_90 = block;
      bVar35 = false;
      lVar31 = 0;
      block = local_90;
      while( true ) {
        while( true ) {
          if (!bVar35) {
            FVar13 = FT_Stream_TryRead(local_58,block + sVar16,local_98 - sVar16);
            lVar30 = FVar13 + sVar16;
            sVar16 = 0;
            block = local_90;
          }
          lVar7 = local_60;
          uVar19 = local_98;
          sVar17 = lVar30 - lVar31;
          if (sVar17 == 0 || lVar30 < lVar31) goto LAB_0013aec6;
          if (iVar12 != (char)block[lVar31]) break;
          lVar31 = lVar31 + 1;
          iVar12 = 0x100;
          bVar35 = true;
        }
        pcVar2 = block + lVar31;
        bVar35 = true;
        lVar29 = 0;
        lVar34 = lVar31;
        while ((cVar1 = block[lVar34], cVar1 != '\n' && (cVar1 != '\r'))) {
          lVar34 = lVar34 + 1;
          lVar29 = lVar29 + 1;
          bVar35 = lVar34 < lVar30;
          if (lVar30 <= lVar34) goto LAB_0013aec6;
        }
        if (!bVar35) break;
        block[lVar34] = 0;
        if (((*pcVar2 != '\x1a') && (*pcVar2 != '#')) && (lVar31 < lVar34)) {
          local_50 = sVar16;
          local_48 = FVar13;
          iVar12 = (*(code *)local_b8)(pcVar2,lVar29,local_60,local_b8,local_c0);
          local_88[0] = CONCAT44(local_88[0]._4_4_,iVar12);
          if (iVar12 == -1) {
            uVar10 = (*(code *)local_b8)(pcVar2,lVar29,lVar7,local_b8,local_c0);
            local_88[0] = CONCAT44(local_88[0]._4_4_,uVar10);
          }
          sVar16 = local_50;
          FVar13 = local_48;
          pFVar27 = local_c8;
          block = local_90;
          bdfface = local_d8;
          face_index = local_cc;
          if ((int)local_88[0] != 0) goto LAB_0013af85;
        }
        local_60 = local_60 + 1;
        block[lVar34] = cVar1;
        lVar31 = lVar34 + 1;
        iVar12 = 0x100;
        if (cVar1 == '\r') {
          iVar12 = 10;
        }
        if (cVar1 == '\n') {
          iVar12 = 0xd;
        }
        bVar35 = true;
      }
LAB_0013aec6:
      pFVar27 = local_c8;
      bdfface = local_d8;
      face_index = local_cc;
      if (FVar13 == 0) break;
      if (lVar31 != 0) {
        memmove(block,block + lVar31,sVar17);
        sVar16 = sVar17;
        FVar13 = sVar17;
        lVar30 = lVar31;
        block = local_90;
        goto LAB_0013ad74;
      }
      if (local_98 < 0x10000) {
        uVar28 = local_98 * 2;
        block = (undefined1 *)ft_mem_realloc(local_68,1,local_98,uVar28,block,(FT_Error *)local_88);
        bVar35 = (int)local_88[0] == 0;
        local_98 = uVar19;
        if (bVar35) {
          sVar16 = uVar19;
          local_98 = uVar28;
        }
      }
      else {
        local_88[0] = CONCAT44(local_88[0]._4_4_,6);
        bVar35 = false;
        local_98 = uVar19;
      }
      pFVar27 = local_c8;
      bdfface = local_d8;
      face_index = local_cc;
    } while (bVar35);
  }
LAB_0013af85:
  ft_mem_free(local_68,block);
  local_dc = (int)local_88[0];
  if ((int)local_88[0] == 0) {
    uVar19 = local_c0[7];
    if (uVar19 != 0) {
      if (*(int *)(uVar19 + 0x30) != 8) {
        *(undefined2 *)(uVar19 + 0x34) = *(undefined2 *)(uVar19 + 8);
      }
      if (local_c0[1] != *(long *)(uVar19 + 0x70) + *(long *)(uVar19 + 0x58)) {
        *(undefined2 *)(uVar19 + 0x880f0) = 1;
      }
      if ((*(long *)(uVar19 + 0x70) != 0 || *(long *)(uVar19 + 0x58) != 0) &&
         (*(int *)local_c0[8] != 0)) {
        sVar8 = (short)local_c0[3];
        uVar11 = (int)*(short *)((long)local_c0 + 0x1c) - (int)sVar8;
        if (uVar11 != *(ushort *)(uVar19 + 8)) {
          *(short *)(uVar19 + 8) = (short)uVar11;
          *(undefined2 *)(uVar19 + 0x880f0) = 1;
        }
        if (*(short *)(uVar19 + 0xc) != sVar8) {
          *(short *)(uVar19 + 0xc) = sVar8;
          *(undefined2 *)(uVar19 + 0x880f0) = 1;
        }
        sVar8 = *(short *)((long)local_c0 + 0x1e);
        if (*(short *)(uVar19 + 0x10) != sVar8) {
          *(short *)(uVar19 + 0x10) = sVar8;
          *(undefined2 *)(uVar19 + 0x880f0) = 1;
        }
        sVar26 = (short)local_c0[4];
        if (*(short *)(uVar19 + 0x12) != sVar26) {
          *(short *)(uVar19 + 0x12) = sVar26;
          *(short *)(uVar19 + 0xe) = -sVar26;
          *(undefined2 *)(uVar19 + 0x880f0) = 1;
        }
        if ((int)sVar26 + (int)sVar8 != (uint)*(ushort *)(uVar19 + 10)) {
          *(short *)(uVar19 + 10) = (short)((int)sVar26 + (int)sVar8);
        }
      }
    }
    if ((*local_c0 & 1) == 0) {
      if (uVar19 == 0) {
        local_dc = 3;
      }
      else {
        lVar30 = *(long *)(uVar19 + 0xa0);
        if (lVar30 != 0) {
          pvVar20 = ft_mem_realloc(*(FT_Memory *)(uVar19 + 0x880f8),1,lVar30,lVar30 + 1,
                                   *(void **)(uVar19 + 0x98),&local_dc);
          uVar19 = local_c0[7];
          *(FT_Pointer *)(uVar19 + 0x98) = pvVar20;
          if (local_dc != 0) goto LAB_0013afaa;
          *(undefined1 *)((long)pvVar20 + *(long *)(uVar19 + 0xa0)) = 0;
        }
      }
      font_00 = (bdf_font_t *)local_c0[7];
      P = local_c0;
      goto LAB_0013afca;
    }
    if ((*local_c0 & 0x20) == 0) {
      local_dc = 0xb9;
    }
    else {
      local_dc = 0xba;
    }
  }
LAB_0013afaa:
  P = local_c0;
  bdf_free_font((bdf_font_t *)local_c0[7]);
  ft_mem_free(pFVar27,(void *)P[7]);
  P[7] = 0;
  font_00 = (bdf_font_t *)0x0;
LAB_0013afca:
  if (P != (ulong *)0x0) {
    if ((FT_Memory)P[0x880c] != (FT_Memory)0x0) {
      ft_mem_free((FT_Memory)P[0x880c],(void *)P[0x8809]);
      P[0x880b] = 0;
      P[0x880c] = 0;
      P[0x8809] = 0;
      P[0x880a] = 0;
    }
    ft_mem_free(pFVar27,(void *)P[5]);
    P[5] = 0;
    ft_mem_free(pFVar27,P);
  }
  local_e0 = local_dc;
  if ((char)local_dc == -0x50) {
    BDF_Face_Done(bdfface);
    local_e0 = 2;
  }
  else if (local_dc == 0) {
    bdfface[1].face_flags = (FT_Long)font_00;
    if ((short)face_index == 0 || face_index < 1) {
      bdfface->num_faces = 1;
      bdfface->face_index = 0;
      *(byte *)&bdfface->face_flags = (byte)bdfface->face_flags | 0x92;
      pbVar14 = bdf_get_font_property(font_00,"SPACING");
      if (((pbVar14 != (bdf_property_t *)0x0) && (pbVar14->format == 1)) &&
         (((byte *)(pbVar14->value).atom != (byte *)0x0 &&
          ((uVar11 = (byte)*(pbVar14->value).atom - 0x43, uVar11 < 0x2b &&
           ((0x40100000401U >> ((ulong)uVar11 & 0x3f) & 1) != 0)))))) {
        *(byte *)&bdfface->face_flags = (byte)bdfface->face_flags | 4;
      }
      pbVar14 = bdf_get_font_property(font_00,"FAMILY_NAME");
      if ((pbVar14 == (bdf_property_t *)0x0) || ((pbVar14->value).atom == (char *)0x0)) {
        bdfface->family_name = (FT_String *)0x0;
      }
      else {
        pFVar15 = (FT_String *)ft_mem_strdup(pFVar27,(pbVar14->value).atom,&local_e0);
        bdfface->family_name = pFVar15;
        if (local_e0 != 0) {
          return local_e0;
        }
      }
      local_dc = 0;
      memory = bdfface->memory;
      font = (bdf_font_t *)bdfface[1].face_flags;
      local_a8 = (char *)0x0;
      pcStack_a0 = (char *)0x0;
      local_b8 = (undefined1  [8])0x0;
      pcStack_b0 = (char *)0x0;
      bdfface->style_flags = 0;
      pbVar14 = bdf_get_font_property(font,"SLANT");
      if ((((pbVar14 != (bdf_property_t *)0x0) && (pbVar14->format == 1)) &&
          ((byte *)(pbVar14->value).atom != (byte *)0x0)) &&
         ((uVar11 = (byte)*(pbVar14->value).atom - 0x49, uVar11 < 0x27 &&
          ((0x4100000041U >> ((ulong)uVar11 & 0x3f) & 1) != 0)))) {
        *(byte *)&bdfface->style_flags = (byte)bdfface->style_flags | 1;
        local_a8 = "Italic";
        if ((*(pbVar14->value).atom & 0xdfU) == 0x4f) {
          local_a8 = "Oblique";
        }
      }
      pbVar14 = bdf_get_font_property(font,"WEIGHT_NAME");
      if (((pbVar14 != (bdf_property_t *)0x0) && (pbVar14->format == 1)) &&
         (((byte *)(pbVar14->value).atom != (byte *)0x0 &&
          ((byte)(*(pbVar14->value).atom | 0x20U) == 0x62)))) {
        *(byte *)&bdfface->style_flags = (byte)bdfface->style_flags | 2;
        pcStack_b0 = "Bold";
      }
      pbVar14 = bdf_get_font_property(font,"SETWIDTH_NAME");
      if ((((pbVar14 != (bdf_property_t *)0x0) && (pbVar14->format == 1)) &&
          (pcVar2 = (pbVar14->value).atom, pcVar2 != (char *)0x0)) &&
         (((cVar1 = *pcVar2, cVar1 != '\0' && (cVar1 != 'N')) && (cVar1 != 'n')))) {
        pcStack_a0 = pcVar2;
      }
      pbVar14 = bdf_get_font_property(font,"ADD_STYLE_NAME");
      if (((pbVar14 != (bdf_property_t *)0x0) && (pbVar14->format == 1)) &&
         ((pFVar3 = (FT_Face)(pbVar14->value).atom, pFVar3 != (FT_Face)0x0 &&
          (((cVar1 = (char)pFVar3->num_faces, cVar1 != '\0' && (cVar1 != 'N')) && (cVar1 != 'n')))))
         ) {
        local_b8 = (undefined1  [8])pFVar3;
      }
      FVar32 = 0;
      lVar30 = 0;
      do {
        local_88[lVar30] = 0;
        if (*(char **)(local_b8 + lVar30 * 8) != (char *)0x0) {
          sVar16 = strlen(*(char **)(local_b8 + lVar30 * 8));
          local_88[lVar30] = sVar16;
          FVar32 = FVar32 + sVar16 + 1;
        }
        lVar30 = lVar30 + 1;
      } while (lVar30 != 4);
      if (FVar32 == 0) {
        local_b8 = (undefined1  [8])0x18f57b;
        local_88[0] = 7;
        FVar32 = 8;
      }
      local_c8 = pFVar27;
      pFVar15 = (FT_String *)ft_mem_alloc(memory,FVar32,&local_dc);
      FVar6 = local_dc;
      bdfface->style_name = pFVar15;
      if (local_dc == 0) {
        lVar30 = 0;
        do {
          __src = *(void **)(local_b8 + lVar30 * 8);
          if (__src != (void *)0x0) {
            sVar16 = local_88[lVar30];
            if (pFVar15 != bdfface->style_name) {
              *pFVar15 = ' ';
              pFVar15 = pFVar15 + 1;
            }
            memcpy(pFVar15,__src,sVar16);
            if (((lVar30 == 3) || (lVar30 == 0)) && (sVar16 != 0)) {
              sVar17 = 0;
              do {
                if (pFVar15[sVar17] == ' ') {
                  pFVar15[sVar17] = '-';
                }
                sVar17 = sVar17 + 1;
              } while (sVar16 != sVar17);
            }
            pFVar15 = pFVar15 + sVar16;
          }
          lVar30 = lVar30 + 1;
        } while (lVar30 != 4);
        *pFVar15 = '\0';
      }
      local_e0 = FVar6;
      if (FVar6 == 0) {
        local_e0 = local_dc;
      }
      if (local_e0 == 0) {
        bdfface->num_glyphs = font_00->glyphs_size + 1;
        bdfface->num_fixed_sizes = 1;
        local_d8 = bdfface;
        pFVar18 = (FT_Bitmap_Size *)ft_mem_realloc(local_c8,0x20,0,1,(void *)0x0,&local_e0);
        pFVar3 = local_d8;
        bdfface->available_sizes = pFVar18;
        if (local_e0 == 0) {
          pFVar18->x_ppem = 0;
          pFVar18->y_ppem = 0;
          pFVar18->height = 0;
          pFVar18->width = 0;
          *(undefined4 *)&pFVar18->field_0x4 = 0;
          pFVar18->size = 0;
          if (font_00->font_ascent - 0x8000U < 0xffffffffffff0001) {
            lVar30 = 0x7fff;
            if (font_00->font_ascent < 0) {
              lVar30 = -0x7fff;
            }
            font_00->font_ascent = lVar30;
          }
          if (font_00->font_descent - 0x8000U < 0xffffffffffff0001) {
            lVar30 = 0x7fff;
            if (font_00->font_descent < 0) {
              lVar30 = -0x7fff;
            }
            font_00->font_descent = lVar30;
          }
          pFVar18->height = (short)(int)font_00->font_descent + (short)(int)font_00->font_ascent;
          pbVar14 = bdf_get_font_property(font_00,"AVERAGE_WIDTH");
          if (pbVar14 == (bdf_property_t *)0x0) {
            FVar32 = FT_MulDiv((long)pFVar18->height,2,3);
            sVar8 = (short)FVar32;
          }
          else {
            sVar8 = 0x7fff;
            if (0xfffffffffff6001c < (pbVar14->value).l - 0x4fff2U) {
              auVar5 = SEXT816((pbVar14->value).l + 5) * SEXT816(0x6666666666666667);
              sVar26 = (short)(auVar5._8_4_ >> 2) - (auVar5._14_2_ >> 0xf);
              sVar8 = -sVar26;
              if (0 < sVar26) {
                sVar8 = sVar26;
              }
            }
          }
          pFVar18->width = sVar8;
          pbVar14 = bdf_get_font_property(font_00,"POINT_SIZE");
          if (pbVar14 == (bdf_property_t *)0x0) {
            uVar19 = font_00->point_size;
            if (uVar19 == 0) {
              FVar32 = (long)pFVar18->width << 6;
            }
            else {
              FVar32 = 0x7fff;
              if (uVar19 < 0x8000) {
                FVar32 = uVar19 << 6;
              }
            }
          }
          else {
            lVar30 = (pbVar14->value).l;
            FVar32 = 0x7fff;
            if (0xfffffffffff5f67a < lVar30 - 0x504c3U) {
              lVar31 = -lVar30;
              if (0 < lVar30) {
                lVar31 = lVar30;
              }
              FVar32 = FT_MulDiv(lVar31,0x70800,0x11a4e);
            }
          }
          pFVar18->size = FVar32;
          pbVar14 = bdf_get_font_property(font_00,"PIXEL_SIZE");
          if (pbVar14 != (bdf_property_t *)0x0) {
            uVar19 = 0x1fffc0;
            if (0xffffffffffff0000 < (pbVar14->value).l - 0x8000U) {
              iVar24 = (int)(short)(pbVar14->value).l;
              iVar12 = -iVar24;
              if (0 < iVar24) {
                iVar12 = iVar24;
              }
              uVar19 = (ulong)(uint)(iVar12 << 6);
            }
            pFVar18->y_ppem = uVar19;
          }
          pbVar14 = bdf_get_font_property(font_00,"RESOLUTION_X");
          paVar25 = &pbVar14->value;
          if (pbVar14 == (bdf_property_t *)0x0) {
            paVar25 = (anon_union_8_3_ccdffb78_for_value *)&font_00->resolution_x;
          }
          lVar30 = paVar25->l;
          if (lVar30 == 0) {
            sVar8 = 0;
          }
          else {
            sVar8 = 0x7fff;
            if (0xffffffffffff0000 < lVar30 - 0x8000U) {
              sVar26 = (short)lVar30;
              sVar8 = -sVar26;
              if (0 < sVar26) {
                sVar8 = sVar26;
              }
            }
          }
          pbVar14 = bdf_get_font_property(font_00,"RESOLUTION_Y");
          paVar25 = &pbVar14->value;
          if (pbVar14 == (bdf_property_t *)0x0) {
            paVar25 = (anon_union_8_3_ccdffb78_for_value *)&font_00->resolution_y;
          }
          lVar30 = paVar25->l;
          if (lVar30 == 0) {
            sVar26 = 0;
          }
          else {
            sVar26 = 0x7fff;
            if (0xffffffffffff0000 < lVar30 - 0x8000U) {
              sVar9 = (short)lVar30;
              sVar26 = -sVar9;
              if (0 < sVar9) {
                sVar26 = sVar9;
              }
            }
          }
          if (pFVar18->y_ppem == 0) {
            pFVar18->y_ppem = pFVar18->size;
            if (sVar26 != 0) {
              FVar32 = FT_MulDiv(pFVar18->size,(long)sVar26,0x48);
              pFVar18->y_ppem = FVar32;
            }
          }
          FVar32 = pFVar18->y_ppem;
          if ((sVar8 != 0) && (sVar26 != 0)) {
            FVar32 = FT_MulDiv(FVar32,(long)sVar8,(long)sVar26);
          }
          pFVar27 = local_c8;
          pFVar18->x_ppem = FVar32;
          pbVar4 = font_00->glyphs;
          pvVar20 = ft_mem_realloc(local_c8,0x10,0,font_00->glyphs_size,(void *)0x0,&local_e0);
          pFVar3[1].style_flags = (FT_Long)pvVar20;
          if (local_e0 == 0) {
            local_d8[1].num_fixed_sizes = 0;
            uVar19 = font_00->glyphs_size;
            if (uVar19 != 0) {
              lVar30 = font_00->default_char;
              puVar21 = (undefined2 *)((long)pvVar20 + 8);
              plVar33 = &pbVar4->encoding;
              uVar28 = 0;
              do {
                lVar31 = *plVar33;
                *(long *)(puVar21 + -4) = lVar31;
                *puVar21 = (short)uVar28;
                if ((uVar28 < 0xffffffff) && (lVar31 == lVar30)) {
                  local_d8[1].num_fixed_sizes = (FT_Int)uVar28;
                }
                uVar28 = uVar28 + 1;
                puVar21 = puVar21 + 8;
                plVar33 = plVar33 + 7;
              } while (uVar19 != uVar28);
            }
          }
          if (local_e0 == 0) {
            pbVar14 = bdf_get_font_property(font_00,"CHARSET_REGISTRY");
            pbVar22 = bdf_get_font_property(font_00,"CHARSET_ENCODING");
            pFVar3 = local_d8;
            if ((((pbVar22 == (bdf_property_t *)0x0 || pbVar14 == (bdf_property_t *)0x0) ||
                 (pbVar14->format != 1)) || (pbVar22->format != 1)) ||
               (((pbVar14->value).atom == (char *)0x0 || ((pbVar22->value).atom == (char *)0x0)))) {
              local_b8 = (undefined1  [8])local_d8;
              pcStack_b0 = (char *)0x741444f42;
              local_e0 = FT_CMap_New(&bdf_cmap_class,(FT_Pointer)0x0,(FT_CharMap)local_b8,
                                     (FT_CMap_conflict *)0x0);
              if (pFVar3->num_charmaps != 0) {
                pFVar3->charmap = *pFVar3->charmaps;
              }
            }
            else {
              pvVar20 = ft_mem_strdup(pFVar27,(pbVar22->value).atom,&local_e0);
              local_d8[1].num_faces = (FT_Long)pvVar20;
              if (local_e0 == 0) {
                pbVar23 = (byte *)ft_mem_strdup(local_c8,(pbVar14->value).atom,&local_e0);
                local_d8[1].face_index = (FT_Long)pbVar23;
                if (local_e0 == 0) {
                  bVar35 = true;
                  if ((((*pbVar23 | 0x20) == 0x69) && ((pbVar23[1] | 0x20) == 0x73)) &&
                     ((pbVar23[2] | 0x20) == 0x6f)) {
                    pbVar23 = pbVar23 + 3;
                    iVar12 = strcmp((char *)pbVar23,"10646");
                    if ((iVar12 == 0) ||
                       ((iVar12 = strcmp((char *)pbVar23,"8859"), iVar12 == 0 &&
                        (iVar12 = strcmp((char *)local_d8[1].num_faces,"1"), iVar12 == 0)))) {
                      bVar35 = false;
                    }
                    else {
                      iVar12 = strcmp((char *)pbVar23,"646.1991");
                      if (iVar12 == 0) {
                        iVar12 = strcmp((char *)local_d8[1].num_faces,"IRV");
                        bVar35 = iVar12 != 0;
                      }
                    }
                  }
                  local_b8 = (undefined1  [8])local_d8;
                  pcStack_b0 = (char *)0x0;
                  if (!bVar35) {
                    pcStack_b0 = (char *)0x10003756e6963;
                  }
                  local_e0 = FT_CMap_New(&bdf_cmap_class,(FT_Pointer)0x0,(FT_CharMap)local_b8,
                                         (FT_CMap_conflict *)0x0);
                }
              }
            }
          }
        }
      }
    }
    else {
      BDF_Face_Done(bdfface);
      local_e0 = 6;
    }
  }
  return local_e0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  BDF_Face_Init( FT_Stream      stream,
                 FT_Face        bdfface,        /* BDF_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    FT_Error       error  = FT_Err_Ok;
    BDF_Face       face   = (BDF_Face)bdfface;
    FT_Memory      memory = FT_FACE_MEMORY( face );

    bdf_font_t*    font = NULL;
    bdf_options_t  options;

    FT_UNUSED( num_params );
    FT_UNUSED( params );


    FT_TRACE2(( "BDF driver\n" ));

    if ( FT_STREAM_SEEK( 0 ) )
      goto Exit;

    options.correct_metrics = 1;   /* FZ XXX: options semantics */
    options.keep_unencoded  = 1;
    options.keep_comments   = 0;
    options.font_spacing    = BDF_PROPORTIONAL;

    error = bdf_load_font( stream, memory, &options, &font );
    if ( FT_ERR_EQ( error, Missing_Startfont_Field ) )
    {
      FT_TRACE2(( "  not a BDF file\n" ));
      goto Fail;
    }
    else if ( error )
      goto Exit;

    /* we have a bdf font: let's construct the face object */
    face->bdffont = font;

    /* BDF cannot have multiple faces in a single font file.
     * XXX: non-zero face_index is already invalid argument, but
     *      Type1, Type42 driver has a convention to return
     *      an invalid argument error when the font could be
     *      opened by the specified driver.
     */
    if ( face_index > 0 && ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "BDF_Face_Init: invalid face index\n" ));
      BDF_Face_Done( bdfface );
      return FT_THROW( Invalid_Argument );
    }

    {
      bdf_property_t*  prop = NULL;


      FT_TRACE4(( "  number of glyphs: allocated %d (used %d)\n",
                  font->glyphs_size,
                  font->glyphs_used ));
      FT_TRACE4(( "  number of unencoded glyphs: allocated %d (used %d)\n",
                  font->unencoded_size,
                  font->unencoded_used ));

      bdfface->num_faces  = 1;
      bdfface->face_index = 0;

      bdfface->face_flags |= FT_FACE_FLAG_FIXED_SIZES |
                             FT_FACE_FLAG_HORIZONTAL  |
                             FT_FACE_FLAG_FAST_GLYPHS;

      prop = bdf_get_font_property( font, "SPACING" );
      if ( prop && prop->format == BDF_ATOM                             &&
           prop->value.atom                                             &&
           ( *(prop->value.atom) == 'M' || *(prop->value.atom) == 'm' ||
             *(prop->value.atom) == 'C' || *(prop->value.atom) == 'c' ) )
        bdfface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* FZ XXX: TO DO: FT_FACE_FLAGS_VERTICAL   */
      /* FZ XXX: I need a font to implement this */

      prop = bdf_get_font_property( font, "FAMILY_NAME" );
      if ( prop && prop->value.atom )
      {
        if ( FT_STRDUP( bdfface->family_name, prop->value.atom ) )
          goto Exit;
      }
      else
        bdfface->family_name = NULL;

      if ( FT_SET_ERROR( bdf_interpret_style( face ) ) )
        goto Exit;

      /* the number of glyphs (with one slot for the undefined glyph */
      /* at position 0 and all unencoded glyphs)                     */
      bdfface->num_glyphs = (FT_Long)( font->glyphs_size + 1 );

      bdfface->num_fixed_sizes = 1;
      if ( FT_NEW_ARRAY( bdfface->available_sizes, 1 ) )
        goto Exit;

      {
        FT_Bitmap_Size*  bsize = bdfface->available_sizes;
        FT_Short         resolution_x = 0, resolution_y = 0;
        long             value;


        FT_ZERO( bsize );

        /* sanity checks */
        if ( font->font_ascent > 0x7FFF || font->font_ascent < -0x7FFF )
        {
          font->font_ascent = font->font_ascent < 0 ? -0x7FFF : 0x7FFF;
          FT_TRACE0(( "BDF_Face_Init: clamping font ascent to value %d\n",
                      font->font_ascent ));
        }
        if ( font->font_descent > 0x7FFF || font->font_descent < -0x7FFF )
        {
          font->font_descent = font->font_descent < 0 ? -0x7FFF : 0x7FFF;
          FT_TRACE0(( "BDF_Face_Init: clamping font descent to value %d\n",
                      font->font_descent ));
        }

        bsize->height = (FT_Short)( font->font_ascent + font->font_descent );

        prop = bdf_get_font_property( font, "AVERAGE_WIDTH" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative average width\n" ));
#endif
          if ( prop->value.l >    0x7FFFL * 10 - 5   ||
               prop->value.l < -( 0x7FFFL * 10 - 5 ) )
          {
            bsize->width = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping average width to value %d\n",
                        bsize->width ));
          }
          else
            bsize->width = FT_ABS( (FT_Short)( ( prop->value.l + 5 ) / 10 ) );
        }
        else
        {
          /* this is a heuristical value */
          bsize->width = (FT_Short)FT_MulDiv( bsize->height, 2, 3 );
        }

        prop = bdf_get_font_property( font, "POINT_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative point size\n" ));
#endif
          /* convert from 722.7 decipoints to 72 points per inch */
          if ( prop->value.l >  0x504C2L || /* 0x7FFF * 72270/7200 */
               prop->value.l < -0x504C2L )
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = FT_MulDiv( FT_ABS( prop->value.l ),
                                     64 * 7200,
                                     72270L );
        }
        else if ( font->point_size )
        {
          if ( font->point_size > 0x7FFF )
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = (FT_Pos)font->point_size << 6;
        }
        else
        {
          /* this is a heuristical value */
          bsize->size = bsize->width * 64;
        }

        prop = bdf_get_font_property( font, "PIXEL_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative pixel size\n" ));
#endif
          if ( prop->value.l > 0x7FFF || prop->value.l < -0x7FFF )
          {
            bsize->y_ppem = 0x7FFF << 6;
            FT_TRACE0(( "BDF_Face_Init: clamping pixel size to value %d\n",
                        bsize->y_ppem ));
          }
          else
            bsize->y_ppem = FT_ABS( (FT_Short)prop->value.l ) << 6;
        }

        prop = bdf_get_font_property( font, "RESOLUTION_X" );
        if ( prop )
          value = prop->value.l;
        else
          value = (long)font->resolution_x;
        if ( value )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( value < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative X resolution\n" ));
#endif
          if ( value > 0x7FFF || value < -0x7FFF )
          {
            resolution_x = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping X resolution to value %d\n",
                        resolution_x ));
          }
          else
            resolution_x = FT_ABS( (FT_Short)value );
        }

        prop = bdf_get_font_property( font, "RESOLUTION_Y" );
        if ( prop )
          value = prop->value.l;
        else
          value = (long)font->resolution_y;
        if ( value )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( value < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative Y resolution\n" ));
#endif
          if ( value > 0x7FFF || value < -0x7FFF )
          {
            resolution_y = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping Y resolution to value %d\n",
                        resolution_y ));
          }
          else
            resolution_y = FT_ABS( (FT_Short)value );
        }

        if ( bsize->y_ppem == 0 )
        {
          bsize->y_ppem = bsize->size;
          if ( resolution_y )
            bsize->y_ppem = FT_MulDiv( bsize->y_ppem, resolution_y, 72 );
        }
        if ( resolution_x && resolution_y )
          bsize->x_ppem = FT_MulDiv( bsize->y_ppem,
                                     resolution_x,
                                     resolution_y );
        else
          bsize->x_ppem = bsize->y_ppem;
      }

      /* encoding table */
      {
        bdf_glyph_t*   cur = font->glyphs;
        unsigned long  n;


        if ( FT_NEW_ARRAY( face->en_table, font->glyphs_size ) )
          goto Exit;

        face->default_glyph = 0;
        for ( n = 0; n < font->glyphs_size; n++ )
        {
          (face->en_table[n]).enc = cur[n].encoding;
          FT_TRACE4(( "  idx %d, val 0x%lX\n", n, cur[n].encoding ));
          (face->en_table[n]).glyph = (FT_UShort)n;

          if ( cur[n].encoding == font->default_char )
          {
            if ( n < FT_UINT_MAX )
              face->default_glyph = (FT_UInt)n;
            else
              FT_TRACE1(( "BDF_Face_Init:"
                          " idx %d is too large for this system\n", n ));
          }
        }
      }

      /* charmaps */
      {
        bdf_property_t  *charset_registry, *charset_encoding;
        FT_Bool          unicode_charmap  = 0;


        charset_registry =
          bdf_get_font_property( font, "CHARSET_REGISTRY" );
        charset_encoding =
          bdf_get_font_property( font, "CHARSET_ENCODING" );
        if ( charset_registry && charset_encoding )
        {
          if ( charset_registry->format == BDF_ATOM &&
               charset_encoding->format == BDF_ATOM &&
               charset_registry->value.atom         &&
               charset_encoding->value.atom         )
          {
            const char*  s;


            if ( FT_STRDUP( face->charset_encoding,
                            charset_encoding->value.atom ) ||
                 FT_STRDUP( face->charset_registry,
                            charset_registry->value.atom ) )
              goto Exit;

            /* Uh, oh, compare first letters manually to avoid dependency */
            /* on locales.                                                */
            s = face->charset_registry;
            if ( ( s[0] == 'i' || s[0] == 'I' ) &&
                 ( s[1] == 's' || s[1] == 'S' ) &&
                 ( s[2] == 'o' || s[2] == 'O' ) )
            {
              s += 3;
              if ( !ft_strcmp( s, "10646" )                      ||
                   ( !ft_strcmp( s, "8859" ) &&
                     !ft_strcmp( face->charset_encoding, "1" ) ) )
                unicode_charmap = 1;
              /* another name for ASCII */
              else if ( !ft_strcmp( s, "646.1991" )                 &&
                        !ft_strcmp( face->charset_encoding, "IRV" ) )
                unicode_charmap = 1;
            }

            {
              FT_CharMapRec  charmap;


              charmap.face        = FT_FACE( face );
              charmap.encoding    = FT_ENCODING_NONE;
              /* initial platform/encoding should indicate unset status? */
              charmap.platform_id = TT_PLATFORM_APPLE_UNICODE;
              charmap.encoding_id = TT_APPLE_ID_DEFAULT;

              if ( unicode_charmap )
              {
                charmap.encoding    = FT_ENCODING_UNICODE;
                charmap.platform_id = TT_PLATFORM_MICROSOFT;
                charmap.encoding_id = TT_MS_ID_UNICODE_CS;
              }

              error = FT_CMap_New( &bdf_cmap_class, NULL, &charmap, NULL );
            }

            goto Exit;
          }
        }

        /* otherwise assume Adobe standard encoding */

        {
          FT_CharMapRec  charmap;


          charmap.face        = FT_FACE( face );
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.platform_id = TT_PLATFORM_ADOBE;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;

          error = FT_CMap_New( &bdf_cmap_class, NULL, &charmap, NULL );

          /* Select default charmap */
          if ( bdfface->num_charmaps )
            bdfface->charmap = bdfface->charmaps[0];
        }
      }
    }

  Exit:
    return error;

  Fail:
    BDF_Face_Done( bdfface );
    return FT_THROW( Unknown_File_Format );
  }